

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O1

void juzzlin::StreamTest::testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp
               (string *message)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  regex epochMicrosecondsRegex;
  stringstream ss;
  undefined1 local_1f8 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  long local_1d0;
  long local_1c8 [2];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1b8;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  juzzlin::SimpleLogger::setTimestampMode(EpochMicroseconds);
  std::__cxx11::stringstream::stringstream(local_198);
  juzzlin::SimpleLogger::setStream(Info,local_188);
  juzzlin::SimpleLogger::SimpleLogger((SimpleLogger *)local_1f8);
  poVar2 = (ostream *)juzzlin::SimpleLogger::info_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(message->_M_dataplus)._M_p,message->_M_string_length);
  juzzlin::SimpleLogger::~SimpleLogger((SimpleLogger *)local_1f8);
  std::__cxx11::stringbuf::str();
  lVar3 = std::__cxx11::string::find(local_1f8,(ulong)(message->_M_dataplus)._M_p,0);
  if (lVar3 == -1) {
    __assert_fail("ss.str().find(message) != std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]SimpleLogger/src/tests/stream_test/stream_test.cpp"
                  ,300,
                  "void juzzlin::StreamTest::testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp(const std::string &)"
                 );
  }
  if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_,
                    (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_1f8._16_8_)->first)._M_current + 1));
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_1b8,"\\d{16} ##",0x10);
  std::__cxx11::stringbuf::str();
  local_1f8._16_8_ = (pointer)0x0;
  _Stack_1e0._M_current = (char *)0x0;
  local_1f8._0_8_ = (pointer)0x0;
  local_1f8._8_8_ = (pointer)0x0;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (local_1d8,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_1d8._M_current + local_1d0),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_1f8,&local_1b8,0);
  if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ - local_1f8._0_8_);
  }
  if (bVar1) {
    if ((long *)local_1d8._M_current != local_1c8) {
      operator_delete(local_1d8._M_current,local_1c8[0] + 1);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_1b8);
    std::__cxx11::stringstream::~stringstream(local_198);
    std::ios_base::~ios_base(local_118);
    return;
  }
  __assert_fail("std::regex_search(ss.str(), epochMicrosecondsRegex)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]SimpleLogger/src/tests/stream_test/stream_test.cpp"
                ,0x130,
                "void juzzlin::StreamTest::testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp(const std::string &)"
               );
}

Assistant:

void testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp(const std::string & message)
{
    L::setTimestampMode(L::TimestampMode::EpochMicroseconds);
    std::stringstream ss;
    L::setStream(L::Level::Info, ss);
    L().info() << message;
    assert(ss.str().find(message) != std::string::npos);

    // Regex to match epoch microseconds format
    const std::regex epochMicrosecondsRegex(R"(\d{16} ##)");
    assert(std::regex_search(ss.str(), epochMicrosecondsRegex));
}